

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O0

TlsKeyOpenSSL * QTlsPrivate::TlsKeyOpenSSL::publicKeyFromX509(X509 *x)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  RSA *pRVar4;
  DSA *pDVar5;
  EC_KEY *pEVar6;
  pointer this;
  long in_FS_OFFSET;
  int keyType;
  EVP_PKEY *pkey;
  TlsKeyOpenSSL *tlsKey;
  unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_> keyRaii;
  pointer in_stack_ffffffffffffffb8;
  TlsKeyOpenSSL *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = operator_new(0x20);
  TlsKeyOpenSSL(in_stack_ffffffffffffffc0);
  std::unique_ptr<QTlsPrivate::TlsKeyOpenSSL,std::default_delete<QTlsPrivate::TlsKeyOpenSSL>>::
  unique_ptr<std::default_delete<QTlsPrivate::TlsKeyOpenSSL>,void>
            ((unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>
              *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined4 *)((long)pvVar3 + 0xc) = 1;
  q_X509_get_pubkey((X509 *)in_stack_ffffffffffffffb8);
  q_EVP_PKEY_get_base_id((EVP_PKEY *)in_stack_ffffffffffffffb8);
  iVar2 = q_EVP_PKEY_type(0x14e553);
  if (iVar2 == 6) {
    pRVar4 = q_EVP_PKEY_get1_RSA((EVP_PKEY *)in_stack_ffffffffffffffb8);
    *(RSA **)((long)pvVar3 + 0x18) = pRVar4;
    *(undefined4 *)((long)pvVar3 + 0x10) = 1;
    *(undefined1 *)((long)pvVar3 + 8) = 0;
  }
  else if (iVar2 == 0x74) {
    pDVar5 = q_EVP_PKEY_get1_DSA((EVP_PKEY *)in_stack_ffffffffffffffb8);
    *(DSA **)((long)pvVar3 + 0x18) = pDVar5;
    *(undefined4 *)((long)pvVar3 + 0x10) = 2;
    *(undefined1 *)((long)pvVar3 + 8) = 0;
  }
  else if (iVar2 == 0x198) {
    pEVar6 = q_EVP_PKEY_get1_EC_KEY((EVP_PKEY *)in_stack_ffffffffffffffb8);
    *(EC_KEY **)((long)pvVar3 + 0x18) = pEVar6;
    *(undefined4 *)((long)pvVar3 + 0x10) = 3;
    *(undefined1 *)((long)pvVar3 + 8) = 0;
  }
  q_EVP_PKEY_free((EVP_PKEY *)0x14e611);
  this = std::
         unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>::
         release((unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>
                  *)0x14e61f);
  std::unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>::
  ~unique_ptr((unique_ptr<QTlsPrivate::TlsKeyOpenSSL,_std::default_delete<QTlsPrivate::TlsKeyOpenSSL>_>
               *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TlsKeyOpenSSL *TlsKeyOpenSSL::publicKeyFromX509(X509 *x)
{
    TlsKeyOpenSSL *tlsKey = new TlsKeyOpenSSL;
    std::unique_ptr<TlsKeyOpenSSL> keyRaii(tlsKey);

    tlsKey->keyType = QSsl::PublicKey;

#ifndef OPENSSL_NO_DEPRECATED_3_0

#define get_pubkey(keyName, alg) tlsKey->keyName = q_EVP_PKEY_get1_##alg(pkey)

#else

#define get_pubkey(a, b) tlsKey->genericKey = pkey

#endif

    EVP_PKEY *pkey = q_X509_get_pubkey(x);
    Q_ASSERT(pkey);
    const int keyType = q_EVP_PKEY_type(q_EVP_PKEY_base_id(pkey));

    if (keyType == EVP_PKEY_RSA) {
        get_pubkey(rsa, RSA);
        tlsKey->keyAlgorithm = QSsl::Rsa;
        tlsKey->keyIsNull = false;
    } else if (keyType == EVP_PKEY_DSA) {
        get_pubkey(dsa, DSA);
        tlsKey->keyAlgorithm = QSsl::Dsa;
        tlsKey->keyIsNull = false;
#ifndef OPENSSL_NO_EC
    } else if (keyType == EVP_PKEY_EC) {
        get_pubkey(ec, EC_KEY);
        tlsKey->keyAlgorithm = QSsl::Ec;
        tlsKey->keyIsNull = false;
#endif
    } else if (keyType == EVP_PKEY_DH) {
        // DH unsupported (key is null)
    } else {
        // error? (key is null)
    }

#ifndef OPENSSL_NO_DEPRECATED_3_0
    q_EVP_PKEY_free(pkey);
#endif

    return keyRaii.release();
}